

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

bool __thiscall cmState::Snapshot::RaiseScope(Snapshot *this,string *var,char *varDef)

{
  PositionType *this_00;
  iterator other;
  StackIter begin;
  StackIter end;
  bool bVar1;
  PointerType pSVar2;
  PointerType pSVar3;
  size_t sVar4;
  PointerType pcVar5;
  Snapshot parentDir;
  long *local_68 [2];
  long local_58 [2];
  Snapshot local_48;
  
  this_00 = &this->Position;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  other.Tree = (pSVar3->DirectoryParent).Tree;
  other.Position = (pSVar3->DirectoryParent).Position;
  bVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==(&pSVar2->ScopeParent,other);
  if (bVar1) {
    GetBuildsystemDirectoryParent(&local_48,this);
    bVar1 = IsValid(&local_48);
    if (bVar1) {
      if (varDef == (char *)0x0) {
        RemoveDefinition(&local_48,var);
      }
      else {
        local_68[0] = local_58;
        sVar4 = strlen(varDef);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,varDef,varDef + sVar4);
        pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_48.Position);
        pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar2->Vars);
        cmDefinitions::Set(pcVar5,var,(char *)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
      }
    }
  }
  else {
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
    begin.Tree = (pSVar2->Vars).Tree;
    begin.Position = (pSVar2->Vars).Position;
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
    end.Tree = (pSVar2->Root).Tree;
    end.Position = (pSVar2->Root).Position;
    cmDefinitions::Raise(var,begin,end);
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
    pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar2->Parent);
    cmDefinitions::Set(pcVar5,var,varDef);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmState::Snapshot::RaiseScope(std::string const& var, const char* varDef)
{
  if(this->Position->ScopeParent == this->Position->DirectoryParent)
    {
    Snapshot parentDir = this->GetBuildsystemDirectoryParent();
    if(!parentDir.IsValid())
      {
      return false;
      }
    // Update the definition in the parent directory top scope.  This
    // directory's scope was initialized by the closure of the parent
    // scope, so we do not need to localize the definition first.
    if (varDef)
      {
      parentDir.SetDefinition(var, varDef);
      }
    else
      {
      parentDir.RemoveDefinition(var);
      }
    return true;
    }
  // First localize the definition in the current scope.
  cmDefinitions::Raise(var, this->Position->Vars,
                       this->Position->Root);

  // Now update the definition in the parent scope.
  this->Position->Parent->Set(var, varDef);
  return true;
}